

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryAllocationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::memory::anon_unknown_0::RandomAllocFreeTestInstance::iterate
          (TestStatus *__return_storage_ptr__,RandomAllocFreeTestInstance *this)

{
  Random *rnd;
  pointer *ppMVar1;
  deUint64 *pdVar2;
  ostringstream *poVar3;
  uint uVar4;
  TestLog *pTVar5;
  ulong uVar6;
  unsigned_long uVar7;
  pointer pMVar8;
  pointer pMVar9;
  pointer pMVar10;
  deUint64 dVar11;
  bool bVar12;
  undefined4 uVar13;
  deBool dVar14;
  deUint32 dVar15;
  deUint32 dVar16;
  VkResult result;
  VkDevice pVVar17;
  pointer pHVar18;
  pointer pMVar19;
  InternalError *this_00;
  TestError *this_01;
  pointer pMVar20;
  ulong uVar21;
  long lVar22;
  pointer pMVar24;
  ulong uVar25;
  pointer pMVar26;
  qpTestLog *pqVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  bool bVar31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonEmptyHeaps;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nonFullHeaps;
  VkMemoryAllocateInfo alloc;
  undefined4 local_234;
  unsigned_long *local_218;
  iterator iStack_210;
  unsigned_long *local_208;
  unsigned_long *local_1f8;
  iterator iStack_1f0;
  unsigned_long *local_1e8;
  TestStatus *local_1d8;
  DeviceInterface *local_1d0;
  VkDevice local_1c8;
  ulong local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  TestLog local_1a0 [13];
  ios_base local_138 [264];
  VkDeviceSize VVar23;
  
  local_1d8 = __return_storage_ptr__;
  pVVar17 = Context::getDevice((this->super_TestInstance).m_context);
  local_1d0 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  uVar21 = (this->m_memoryLimits).totalDeviceLocalMemory;
  VVar23 = 0;
  if (uVar21 == 0) {
    VVar23 = this->m_totalDeviceMem;
  }
  lVar22 = VVar23 + this->m_totalSystemMem;
  uVar25 = this->m_allocSysMemSize + lVar22 + 0x400;
  local_1c0 = (this->m_memoryLimits).totalSystemMemory;
  bVar12 = this->m_totalDeviceMem + 0x10 < uVar21;
  if (uVar21 == 0) {
    bVar12 = uVar25 < local_1c0;
  }
  pTVar5 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_1e8 = (unsigned_long *)0x0;
  local_1f8 = (unsigned_long *)0x0;
  iStack_1f0._M_current = (unsigned_long *)0x0;
  local_208 = (unsigned_long *)0x0;
  local_218 = (unsigned_long *)0x0;
  iStack_210._M_current = (unsigned_long *)0x0;
  if (this->m_opNdx == 0) {
    poVar3 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Performing ",0xb);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,
               " random VkAllocMemory() / VkFreeMemory() calls before freeing all memory.",0x49);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
    poVar3 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar5;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Using max 1/8 of the memory in each memory heap.",0x30);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_138);
  }
  local_1b0._0_8_ = (TestLog *)0x0;
  pHVar18 = (this->m_heaps).
            super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = pVVar17;
  local_1b8 = lVar22;
  if ((this->m_heaps).
      super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
      ._M_impl.super__Vector_impl_data._M_finish != pHVar18) {
    bVar31 = local_1c0 <= uVar25;
    do {
      uVar4 = pHVar18[local_1b0._0_8_].heap.flags;
      uVar30 = pHVar18[local_1b0._0_8_].memoryUsage;
      uVar6 = pHVar18[local_1b0._0_8_].maxMemoryUsage;
      if (uVar30 != 0) {
        if (iStack_210._M_current == local_208) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_218,iStack_210,
                     (unsigned_long *)local_1b0);
        }
        else {
          *iStack_210._M_current = local_1b0._0_8_;
          iStack_210._M_current = iStack_210._M_current + 1;
        }
      }
      if ((uVar30 < uVar6) &&
         ((!(bool)((uVar21 == 0 | bVar12 ^ 1U | (uVar4 & 1) == 0) & (uVar21 != 0 || bVar31)) ||
          ((uVar21 != 0 && !bVar31) && (uVar4 & 1) == 0)))) {
        if (iStack_1f0._M_current == local_1e8) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_1f8,iStack_1f0,
                     (unsigned_long *)local_1b0);
        }
        else {
          *iStack_1f0._M_current = local_1b0._0_8_;
          iStack_1f0._M_current = iStack_1f0._M_current + 1;
        }
      }
      local_1b0._0_8_ = (long)(qpTestLog **)local_1b0._0_8_ + 1;
      pHVar18 = (this->m_heaps).
                super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)local_1b0._0_8_ <
             (TestLog *)
             (((long)(this->m_heaps).
                     super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar18 >> 4) *
             -0x3333333333333333));
  }
  if (this->m_opNdx < this->m_opCount) {
    if ((local_218 != iStack_210._M_current) &&
       ((((local_1f8 == iStack_1f0._M_current || (3999 < this->m_memoryObjectCount)) ||
         (local_1c0 <= uVar25)) || (dVar14 = deRandom_getBool(&(this->m_rng).m_rnd), dVar14 != 1))))
    goto LAB_0065d513;
    rnd = &this->m_rng;
    dVar15 = deRandom_getUint32(&rnd->m_rnd);
    local_234 = 0;
    uVar7 = local_1f8[(ulong)dVar15 %
                      ((ulong)((long)iStack_1f0._M_current - (long)local_1f8) >> 3 & 0xffffffff)];
    pHVar18 = (this->m_heaps).
              super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar26 = *(pointer *)
               &pHVar18[uVar7].types.
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
                ._M_impl;
    pMVar8 = pHVar18[uVar7].types.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryType,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryType>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_1b0._8_4_ = 0;
    uVar13 = local_1b0._8_4_;
    local_1b0._8_4_ = 0;
    local_1b0._0_8_ = (TestLog *)0x0;
    if (pMVar26 != pMVar8) {
      iVar28 = 0;
      do {
        if (iVar28 < 1) {
          *(deUint32 *)(local_1b0 + (long)iVar28 * 0xc + 8) = (pMVar26->type).heapIndex;
          *(undefined8 *)(local_1b0 + (long)iVar28 * 0xc) = *(undefined8 *)pMVar26;
        }
        else {
          dVar15 = deRandom_getUint32(&rnd->m_rnd);
          if (dVar15 % (iVar28 + 1U) == 0) {
            local_1b0._8_4_ = (pMVar26->type).heapIndex;
            local_1b0._0_8_ = *(undefined8 *)pMVar26;
          }
        }
        iVar28 = iVar28 + 1;
        pMVar26 = pMVar26 + 1;
      } while (pMVar26 != pMVar8);
      local_234 = local_1b0._0_4_;
      uVar13 = local_1b0._8_4_;
    }
    local_1b0._8_4_ = uVar13;
    uVar4 = pHVar18[uVar7].heap.flags;
    uVar25 = pHVar18[uVar7].maxMemoryUsage - pHVar18[uVar7].memoryUsage;
    if ((uVar4 & 1) == 0 || uVar21 == 0) {
      uVar21 = (this->m_memoryLimits).totalSystemMemory - (local_1b8 + this->m_allocSysMemSize);
    }
    else {
      uVar21 = (this->m_memoryLimits).totalDeviceLocalMemory - this->m_totalDeviceMem;
    }
    if (uVar25 < uVar21) {
      uVar21 = uVar25;
    }
    dVar15 = deRandom_getUint32(&rnd->m_rnd);
    dVar16 = deRandom_getUint32(&rnd->m_rnd);
    uVar21 = CONCAT44(dVar15,dVar16) % uVar21;
    if ((uVar21 != 0) && (pHVar18[uVar7].maxMemoryUsage - pHVar18[uVar7].memoryUsage <= uVar21)) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"Test Error: trying to allocate memory more than the available heap size.",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                 ,0x1bd);
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    pqVar27 = (qpTestLog *)(uVar21 + 1);
    pMVar9 = pHVar18[uVar7].objects.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar9 == pHVar18[uVar7].objects.
                  super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pMVar10 = pHVar18[uVar7].objects.
                super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((long)pMVar9 - (long)pMVar10 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar25 = (long)pMVar9 - (long)pMVar10 >> 4;
      uVar21 = 1;
      if (pMVar9 != pMVar10) {
        uVar21 = uVar25;
      }
      uVar30 = uVar21 + uVar25;
      if (0x7fffffffffffffe < uVar30) {
        uVar30 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar21,uVar25)) {
        uVar30 = 0x7ffffffffffffff;
      }
      if (uVar30 == 0) {
        pMVar19 = (pointer)0x0;
      }
      else {
        pMVar19 = (pointer)operator_new(uVar30 << 4);
      }
      pMVar19[uVar25].memory.m_internal = 0;
      pMVar19[uVar25].size = (VkDeviceSize)pqVar27;
      pMVar24 = pMVar19;
      for (pMVar20 = pMVar10; pMVar9 != pMVar20; pMVar20 = pMVar20 + 1) {
        VVar23 = pMVar20->size;
        (pMVar24->memory).m_internal = (pMVar20->memory).m_internal;
        pMVar24->size = VVar23;
        pMVar24 = pMVar24 + 1;
      }
      if (pMVar10 != (pointer)0x0) {
        operator_delete(pMVar10,(long)pHVar18[uVar7].objects.
                                      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pMVar10);
      }
      pHVar18[uVar7].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_start = pMVar19;
      pHVar18[uVar7].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar24 + 1;
      pHVar18[uVar7].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar19 + uVar30;
    }
    else {
      (pMVar9->memory).m_internal = 0;
      pMVar9->size = (VkDeviceSize)pqVar27;
      pHVar18[uVar7].objects.
      super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar9 + 1;
      pMVar24 = pMVar9;
    }
    local_1b0._0_4_ = 5;
    local_1b0._8_8_ = 0;
    local_1a0[1].m_log._0_4_ = local_234;
    local_1a0[0].m_log = pqVar27;
    result = (*local_1d0->_vptr_DeviceInterface[5])(local_1d0,local_1c8,local_1b0,0,pMVar24);
    ::vk::checkResult(result,
                      "vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &heap.objects.back().memory)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                      ,0x1cf);
    if (pHVar18[uVar7].objects.
        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].memory.m_internal == 0) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,(char *)0x0,"!!heap.objects.back().memory",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryAllocationTests.cpp"
                 ,0x1d0);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this->m_memoryObjectCount = this->m_memoryObjectCount + 1;
    pHVar18[uVar7].memoryUsage = (long)&pqVar27->flags + pHVar18[uVar7].memoryUsage;
    (&this->m_totalSystemMem)[uVar4 & 1] =
         (long)&pqVar27->flags + (&this->m_totalSystemMem)[uVar4 & 1];
    this->m_totalSystemMem = this->m_totalSystemMem + this->m_allocSysMemSize;
  }
  else {
    if (local_218 == iStack_210._M_current) {
      local_1b0._0_8_ = local_1a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Pass","");
      local_1d8->m_code = QP_TEST_RESULT_PASS;
      (local_1d8->m_description)._M_dataplus._M_p = (pointer)&(local_1d8->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8->m_description,local_1b0._0_8_,
                 (long)(qpTestLog **)local_1b0._0_8_ + local_1b0._8_8_);
      if ((TestLog *)local_1b0._0_8_ != local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(ulong)((long)&(local_1a0[0].m_log)->flags + 1));
      }
      goto LAB_0065d831;
    }
LAB_0065d513:
    dVar15 = deRandom_getUint32(&(this->m_rng).m_rnd);
    uVar7 = local_218[(ulong)dVar15 %
                      ((ulong)((long)iStack_210._M_current - (long)local_218) >> 3 & 0xffffffff)];
    pHVar18 = (this->m_heaps).
              super__Vector_base<vkt::memory::(anonymous_namespace)::Heap,_std::allocator<vkt::memory::(anonymous_namespace)::Heap>_>
              ._M_impl.super__Vector_impl_data._M_start;
    dVar15 = deRandom_getUint32(&(this->m_rng).m_rnd);
    lVar22 = *(long *)&pHVar18[uVar7].objects.
                       super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                       ._M_impl.super__Vector_impl_data;
    lVar29 = ((ulong)dVar15 %
             (ulong)((long)pHVar18[uVar7].objects.
                           super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar22 >> 4)) * 0x10;
    uVar4 = pHVar18[uVar7].heap.flags;
    (*local_1d0->_vptr_DeviceInterface[6])(local_1d0,local_1c8,*(undefined8 *)(lVar22 + lVar29),0);
    *(undefined8 *)(lVar22 + lVar29) = 0;
    this->m_memoryObjectCount = this->m_memoryObjectCount - 1;
    lVar22 = ((undefined8 *)(lVar22 + lVar29))[1];
    pHVar18[uVar7].memoryUsage = pHVar18[uVar7].memoryUsage - lVar22;
    (&this->m_totalSystemMem)[uVar4 & 1] = (&this->m_totalSystemMem)[uVar4 & 1] - lVar22;
    this->m_totalSystemMem = this->m_totalSystemMem - this->m_allocSysMemSize;
    pMVar9 = pHVar18[uVar7].objects.
             super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    dVar11 = pMVar9[-1].size;
    pdVar2 = (deUint64 *)
             (*(long *)&pHVar18[uVar7].objects.
                        super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
                        ._M_impl.super__Vector_impl_data + lVar29);
    *pdVar2 = pMVar9[-1].memory.m_internal;
    pdVar2[1] = dVar11;
    ppMVar1 = &pHVar18[uVar7].objects.
               super__Vector_base<vkt::memory::(anonymous_namespace)::MemoryObject,_std::allocator<vkt::memory::(anonymous_namespace)::MemoryObject>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + -1;
  }
  this->m_opNdx = this->m_opNdx + 1;
  tcu::TestStatus::incomplete();
LAB_0065d831:
  if (local_218 != (unsigned_long *)0x0) {
    operator_delete(local_218,(long)local_208 - (long)local_218);
  }
  if (local_1f8 != (unsigned_long *)0x0) {
    operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
  }
  return local_1d8;
}

Assistant:

tcu::TestStatus RandomAllocFreeTestInstance::iterate (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	vkd				= m_context.getDeviceInterface();
	TestLog&				log				= m_context.getTestContext().getLog();
	const bool				isUMA			= m_memoryLimits.totalDeviceLocalMemory == 0;
	const VkDeviceSize		usedSysMem		= isUMA ? (m_totalDeviceMem+m_totalSystemMem) : m_totalSystemMem;
	const bool				canAllocateSys	= usedSysMem + m_allocSysMemSize + 1024 < m_memoryLimits.totalSystemMemory; // \note Always leave room for 1 KiB sys mem alloc
	const bool				canAllocateDev	= isUMA ? canAllocateSys : (m_totalDeviceMem + 16 < m_memoryLimits.totalDeviceLocalMemory);
	vector<size_t>			nonFullHeaps;
	vector<size_t>			nonEmptyHeaps;
	bool					allocateMore;

	if (m_opNdx == 0)
	{
		log << TestLog::Message << "Performing " << m_opCount << " random VkAllocMemory() / VkFreeMemory() calls before freeing all memory." << TestLog::EndMessage;
		log << TestLog::Message << "Using max 1/8 of the memory in each memory heap." << TestLog::EndMessage;
	}

	// Sort heaps based on whether allocations or frees are possible
	for (size_t heapNdx = 0; heapNdx < m_heaps.size(); ++heapNdx)
	{
		const bool	isDeviceLocal	= (m_heaps[heapNdx].heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;
		const bool	isHeapFull		= m_heaps[heapNdx].memoryUsage >= m_heaps[heapNdx].maxMemoryUsage;
		const bool	isHeapEmpty		= m_heaps[heapNdx].memoryUsage == 0;

		if (!isHeapEmpty)
			nonEmptyHeaps.push_back(heapNdx);

		if (!isHeapFull && ((isUMA && canAllocateSys) ||
							(!isUMA && isDeviceLocal && canAllocateDev) ||
							(!isUMA && !isDeviceLocal && canAllocateSys)))
			nonFullHeaps.push_back(heapNdx);
	}

	if (m_opNdx >= m_opCount)
	{
		if (nonEmptyHeaps.empty())
			return tcu::TestStatus::pass("Pass");
		else
			allocateMore = false;
	}
	else if (!nonEmptyHeaps.empty() &&
			 !nonFullHeaps.empty() &&
			 (m_memoryObjectCount < MAX_ALLOCATION_COUNT) &&
			 canAllocateSys)
		allocateMore = m_rng.getBool(); // Randomize if both operations are doable.
	else if (nonEmptyHeaps.empty())
	{
		DE_ASSERT(canAllocateSys);
		allocateMore = true; // Allocate more if there are no objects to free.
	}
	else if (nonFullHeaps.empty() || !canAllocateSys)
		allocateMore = false; // Free objects if there is no free space for new objects.
	else
	{
		allocateMore = false;
		DE_FATAL("Fail");
	}

	if (allocateMore)
	{
		const size_t		nonFullHeapNdx	= (size_t)(m_rng.getUint32() % (deUint32)nonFullHeaps.size());
		const size_t		heapNdx			= nonFullHeaps[nonFullHeapNdx];
		Heap&				heap			= m_heaps[heapNdx];
		const MemoryType&	memoryType		= m_rng.choose<MemoryType>(heap.types.begin(), heap.types.end());
		const bool			isDeviceLocal	= (heap.heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;
		const VkDeviceSize	maxAllocSize	= (isDeviceLocal && !isUMA)
											? de::min(heap.maxMemoryUsage - heap.memoryUsage, (VkDeviceSize)m_memoryLimits.totalDeviceLocalMemory - m_totalDeviceMem)
											: de::min(heap.maxMemoryUsage - heap.memoryUsage, (VkDeviceSize)m_memoryLimits.totalSystemMemory - usedSysMem - m_allocSysMemSize);
		const VkDeviceSize	allocationSize	= 1 + (m_rng.getUint64() % maxAllocSize);

		if ((allocationSize > (deUint64)(heap.maxMemoryUsage - heap.memoryUsage)) && (allocationSize != 1))
			TCU_THROW(InternalError, "Test Error: trying to allocate memory more than the available heap size.");

		const MemoryObject object =
		{
			(VkDeviceMemory)0,
			allocationSize
		};

		heap.objects.push_back(object);

		const VkMemoryAllocateInfo alloc =
		{
			VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	// sType
			DE_NULL,								// pNext
			object.size,							// allocationSize
			memoryType.index						// memoryTypeIndex;
		};

		VK_CHECK(vkd.allocateMemory(device, &alloc, (const VkAllocationCallbacks*)DE_NULL, &heap.objects.back().memory));
		TCU_CHECK(!!heap.objects.back().memory);
		m_memoryObjectCount++;

		heap.memoryUsage										+= allocationSize;
		(isDeviceLocal ? m_totalDeviceMem : m_totalSystemMem)	+= allocationSize;
		m_totalSystemMem										+= m_allocSysMemSize;
	}
	else
	{
		const size_t		nonEmptyHeapNdx	= (size_t)(m_rng.getUint32() % (deUint32)nonEmptyHeaps.size());
		const size_t		heapNdx			= nonEmptyHeaps[nonEmptyHeapNdx];
		Heap&				heap			= m_heaps[heapNdx];
		const size_t		memoryObjectNdx	= m_rng.getUint32() % heap.objects.size();
		MemoryObject&		memoryObject	= heap.objects[memoryObjectNdx];
		const bool			isDeviceLocal	= (heap.heap.flags & VK_MEMORY_HEAP_DEVICE_LOCAL_BIT) != 0;

		vkd.freeMemory(device, memoryObject.memory, (const VkAllocationCallbacks*)DE_NULL);
		memoryObject.memory = (VkDeviceMemory)0;
		m_memoryObjectCount--;

		heap.memoryUsage										-= memoryObject.size;
		(isDeviceLocal ? m_totalDeviceMem : m_totalSystemMem)	-= memoryObject.size;
		m_totalSystemMem										-= m_allocSysMemSize;

		heap.objects[memoryObjectNdx] = heap.objects.back();
		heap.objects.pop_back();

		DE_ASSERT(heap.memoryUsage == 0 || !heap.objects.empty());
	}

	m_opNdx++;
	return tcu::TestStatus::incomplete();
}